

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  HandleTable *this_00;
  size_t __n;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  LRUHandle *this_01;
  LRUHandle **ppLVar6;
  LRUHandle *pLVar7;
  Mutex *__mutex;
  LRUCache *this_02;
  Slice local_40;
  
  uVar3 = HashSlice(key);
  uVar4 = uVar3 >> 0x1c;
  this_02 = this->shard_ + uVar4;
  __mutex = &this->shard_[uVar4].mutex_;
  std::mutex::lock(&__mutex->mu_);
  __n = key->size_;
  this_01 = (LRUHandle *)malloc(__n + 0x47);
  this_01->value = value;
  this_01->deleter = deleter;
  this_01->charge = charge;
  this_01->key_length = __n;
  this_01->hash = uVar3;
  this_01->in_cache = false;
  this_01->refs = 1;
  memcpy(this_01->key_data,key->data_,__n);
  if (this->shard_[uVar4].capacity_ == 0) {
    this_01->next = (LRUHandle *)0x0;
  }
  else {
    this_01->refs = 2;
    this_01->in_cache = true;
    this_01->next = &this->shard_[uVar4].in_use_;
    pLVar7 = this->shard_[uVar4].in_use_.prev;
    this_01->prev = pLVar7;
    pLVar7->next = this_01;
    this->shard_[uVar4].in_use_.prev = this_01;
    psVar1 = &this->shard_[uVar4].usage_;
    *psVar1 = *psVar1 + charge;
    this_00 = &this->shard_[uVar4].table_;
    local_40 = LRUHandle::key(this_01);
    ppLVar6 = HandleTable::FindPointer(this_00,&local_40,this_01->hash);
    pLVar7 = *ppLVar6;
    if (pLVar7 == (LRUHandle *)0x0) {
      this_01->next_hash = (LRUHandle *)0x0;
      *ppLVar6 = this_01;
      uVar5 = this->shard_[uVar4].table_.elems_ + 1;
      this->shard_[uVar4].table_.elems_ = uVar5;
      if (this->shard_[uVar4].table_.length_ < uVar5) {
        HandleTable::Resize(this_00);
      }
    }
    else {
      this_01->next_hash = pLVar7->next_hash;
      *ppLVar6 = this_01;
    }
    LRUCache::FinishErase(this_02,pLVar7);
  }
  do {
    if ((this->shard_[uVar4].usage_ <= this_02->capacity_) ||
       (pLVar7 = this->shard_[uVar4].lru_.next, pLVar7 == &this->shard_[uVar4].lru_)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (Handle *)this_01;
    }
    if (pLVar7->refs != 1) {
      __assert_fail("old->refs == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                    ,0x128,
                    "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                   );
    }
    local_40 = LRUHandle::key(pLVar7);
    pLVar7 = HandleTable::Remove(&this->shard_[uVar4].table_,&local_40,pLVar7->hash);
    bVar2 = LRUCache::FinishErase(this_02,pLVar7);
  } while (bVar2);
  __assert_fail("erased",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                ,299,
                "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
               );
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }